

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint arg_size(uint8_t *arg_mem,char type)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char in_SIL;
  byte *in_RDI;
  uint32_t blob_length;
  uint8_t *arg_pos;
  uint local_24;
  byte *local_20;
  uint local_4;
  
  iVar3 = has_reserved(in_SIL);
  if (iVar3 == 0) {
    local_4 = 0;
  }
  else {
    switch(in_SIL) {
    case 'S':
    case 's':
      local_20 = in_RDI;
      do {
        pbVar4 = local_20 + 1;
        pbVar1 = local_20 + 1;
        local_20 = pbVar4;
      } while (*pbVar1 != 0);
      local_4 = ((4 - (int)(((long)pbVar4 - (long)in_RDI) % 4)) + (int)pbVar4) - (int)in_RDI;
      break;
    default:
      local_4 = 0xffffffff;
      break;
    case 'b':
      bVar2 = in_RDI[3];
      local_24 = (uint)bVar2 |
                 (uint)in_RDI[2] << 8 | (uint)in_RDI[1] << 0x10 | (uint)*in_RDI << 0x18;
      if ((bVar2 & 3) != 0) {
        local_24 = (4 - (bVar2 & 3)) + local_24;
      }
      local_4 = local_24 + 4;
      break;
    case 'c':
    case 'f':
    case 'i':
    case 'm':
    case 'r':
      local_4 = 4;
      break;
    case 'd':
    case 'h':
    case 't':
      local_4 = 8;
    }
  }
  return local_4;
}

Assistant:

static unsigned arg_size(const uint8_t *arg_mem, char type)
{
    if(!has_reserved(type))
        return 0;
    const uint8_t  *arg_pos=arg_mem;
    uint32_t blob_length = 0;
    switch(type)
    {
        case 'h':
        case 't':
        case 'd':
            return 8;
        case 'm':
        case 'r':
        case 'f':
        case 'c':
        case 'i':
            return 4;
        case 'S':
        case 's':
            while(*++arg_pos);
            arg_pos += 4-(arg_pos-arg_mem)%4;
            return arg_pos-arg_mem;
        case 'b':
            blob_length |= (*arg_pos++ << 24);
            blob_length |= (*arg_pos++ << 16);
            blob_length |= (*arg_pos++ << 8);
            blob_length |= (*arg_pos++);
            if(blob_length%4)
                blob_length += 4-blob_length%4;
            arg_pos += blob_length;
            return arg_pos-arg_mem;
        default:
            assert("Invalid Type");
    }
    return -1;
}